

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

ssize_t __thiscall rest_rpc::rpc_client::write(rpc_client *this,int __fd,void *__buf,size_t __n)

{
  request_type rVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  ssize_t extraout_RAX;
  mutable_buffer mVar8;
  array<asio::const_buffer,_2UL> write_buffers;
  value_type *msg;
  const_buffer *in_stack_ffffffffffffff70;
  array<asio::const_buffer,_2UL> *in_stack_ffffffffffffff78;
  void *local_78;
  size_t local_70;
  void *local_58;
  size_t local_50;
  undefined2 uStack_42;
  
  pvVar5 = std::
           deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
           ::operator[]((deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                         *)in_stack_ffffffffffffff70,(size_type)this);
  sVar6 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::length
                    (&pvVar5->content);
  this->write_size_ = (uint32_t)sVar6;
  std::array<asio::const_buffer,_2UL>::array(in_stack_ffffffffffffff78);
  rVar1 = pvVar5->req_type;
  uVar2 = this->write_size_;
  uVar4 = pvVar5->req_id;
  uVar3 = pvVar5->func_id;
  (this->header_).magic = 0x27;
  (this->header_).req_type = rVar1;
  *(undefined2 *)&(this->header_).field_0x2 = uStack_42;
  (this->header_).body_len = uVar2;
  (this->header_).req_id = uVar4;
  (this->header_).func_id = uVar3;
  asio::buffer(in_stack_ffffffffffffff70,(size_t)this);
  asio::const_buffer::const_buffer(in_stack_ffffffffffffff70,(mutable_buffer *)this);
  pvVar7 = std::array<asio::const_buffer,_2UL>::operator[]
                     ((array<asio::const_buffer,_2UL> *)in_stack_ffffffffffffff70,(size_type)this);
  pvVar7->data_ = local_58;
  pvVar7->size_ = local_50;
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::data(&pvVar5->content);
  mVar8 = (mutable_buffer)asio::buffer(in_stack_ffffffffffffff70,(size_t)this);
  asio::const_buffer::const_buffer(in_stack_ffffffffffffff70,(mutable_buffer *)this);
  pvVar7 = std::array<asio::const_buffer,_2UL>::operator[]
                     ((array<asio::const_buffer,_2UL> *)in_stack_ffffffffffffff70,(size_type)this);
  pvVar7->data_ = local_78;
  pvVar7->size_ = local_70;
  async_write<std::array<asio::const_buffer,2ul>,rest_rpc::rpc_client::write()::_lambda(std::error_code_const&,unsigned_long)_1_>
            ((rpc_client *)mVar8.data_,(array<asio::const_buffer,_2UL> *)this,
             (rpc_client *)mVar8.size_);
  return extraout_RAX;
}

Assistant:

void write() {
    auto &msg = outbox_[0];
    write_size_ = (uint32_t)msg.content.length();
    std::array<asio::const_buffer, 2> write_buffers;
    header_ = {MAGIC_NUM, msg.req_type, write_size_, msg.req_id, msg.func_id};
    write_buffers[0] = asio::buffer(&header_, sizeof(rpc_header));
    write_buffers[1] = asio::buffer((char *)msg.content.data(), write_size_);

    async_write(write_buffers,
                [this](const asio::error_code &ec, const size_t length) {
                  if (ec) {
                    has_connected_ = false;
                    close(false);
                    error_callback(ec);

                    return;
                  }

                  std::unique_lock<std::mutex> lock(write_mtx_);
                  if (outbox_.empty()) {
                    return;
                  }

                  ::free((char *)outbox_.front().content.data());
                  outbox_.pop_front();

                  if (!outbox_.empty()) {
                    // more messages to send
                    this->write();
                  }
                });
  }